

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<unsigned_long> Catch::list(Config *config)

{
  bool bVar1;
  unsigned_long uVar2;
  size_t sVar3;
  Option<unsigned_long> *this;
  unsigned_long *_value;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char acVar4 [8];
  Config *in_RSI;
  Option<unsigned_long> *in_RDI;
  Option<unsigned_long> OVar5;
  Config *in_stack_00000060;
  Config *in_stack_00000070;
  Option<unsigned_long> *listedCount;
  Config *in_stack_00000280;
  Config *in_stack_000004e0;
  unsigned_long *in_stack_ffffffffffffff28;
  Option<unsigned_long> *in_stack_ffffffffffffff30;
  unsigned_long local_68;
  long local_60;
  unsigned_long local_58;
  long local_50;
  unsigned_long local_48;
  long local_40;
  unsigned_long local_38;
  long local_30;
  undefined1 local_11;
  Config *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  Option<unsigned_long>::Option(in_RDI);
  bVar1 = Config::listTests(local_10);
  if (bVar1) {
    local_38 = 0;
    uVar2 = Option<unsigned_long>::valueOr(in_RDI,&local_38);
    sVar3 = listTests(in_stack_00000280);
    local_30 = uVar2 + sVar3;
    Option<unsigned_long>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  bVar1 = Config::listTestNamesOnly(local_10);
  if (bVar1) {
    local_48 = 0;
    uVar2 = Option<unsigned_long>::valueOr(in_RDI,&local_48);
    sVar3 = listTestsNamesOnly(in_stack_00000070);
    local_40 = uVar2 + sVar3;
    Option<unsigned_long>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  bVar1 = Config::listTags(local_10);
  if (bVar1) {
    local_58 = 0;
    uVar2 = Option<unsigned_long>::valueOr(in_RDI,&local_58);
    sVar3 = listTags(in_stack_000004e0);
    local_50 = uVar2 + sVar3;
    Option<unsigned_long>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  bVar1 = Config::listReporters(local_10);
  acVar4 = extraout_RDX;
  if (bVar1) {
    local_68 = 0;
    this = (Option<unsigned_long> *)Option<unsigned_long>::valueOr(in_RDI,&local_68);
    _value = (unsigned_long *)listReporters(in_stack_00000060);
    local_60 = (long)_value + (long)(this->storage + -8);
    Option<unsigned_long>::operator=(this,_value);
    acVar4 = extraout_RDX_00;
  }
  OVar5.storage[0] = acVar4[0];
  OVar5.storage[1] = acVar4[1];
  OVar5.storage[2] = acVar4[2];
  OVar5.storage[3] = acVar4[3];
  OVar5.storage[4] = acVar4[4];
  OVar5.storage[5] = acVar4[5];
  OVar5.storage[6] = acVar4[6];
  OVar5.storage[7] = acVar4[7];
  OVar5.nullableValue = (unsigned_long *)in_RDI;
  return OVar5;
}

Assistant:

inline Option<std::size_t> list( Config const& config ) {
        Option<std::size_t> listedCount;
        if( config.listTests() )
            listedCount = listedCount.valueOr(0) + listTests( config );
        if( config.listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( config );
        if( config.listTags() )
            listedCount = listedCount.valueOr(0) + listTags( config );
        if( config.listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters( config );
        return listedCount;
    }